

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_fanout_tree.h
# Opt level: O1

double alex::fanout_tree::compute_level<int,int,alex::AlexCompare>
                 (double expected_insert_frac,long values,uint num_keys,long node,int total_keys,
                 vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                 *used_fanout_tree_nodes,uint level,int max_data_node_keys,
                 bool approximate_model_computation,bool approximate_cost_computation)

{
  pointer *ppFVar1;
  V *values_00;
  iterator iVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  ulong uVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  int num_keys_00;
  int iVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 in_XMM4_Qb;
  LinearModel<int> model;
  DataNodeStats stats;
  double local_110;
  FTNode local_d8;
  double local_88;
  LinearModel<int> local_78;
  ulong local_68;
  double local_60;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *local_58;
  double local_50;
  DataNodeStats local_48;
  
  iVar5 = 1 << (level & 0x1f);
  dVar16 = (double)iVar5;
  local_110 = 0.0;
  if (level != 0x1f) {
    dVar3 = dVar16 * *(double *)(node + 0x10);
    dVar4 = dVar16 * *(double *)(node + 0x18);
    local_68 = (ulong)(int)num_keys;
    local_60 = (double)(int)num_keys;
    iVar8 = 1;
    if (1 < iVar5) {
      iVar8 = iVar5;
    }
    iVar15 = 0;
    local_110 = 0.0;
    uVar12 = 0;
    local_58 = used_fanout_tree_nodes;
    local_50 = expected_insert_frac;
    do {
      uVar14 = (ulong)num_keys;
      if (iVar15 != iVar5 + -1) {
        lVar13 = values;
        if (0 < (int)num_keys) {
          uVar14 = local_68;
          do {
            uVar6 = uVar14 >> 1;
            if ((double)*(int *)(lVar13 + uVar6 * 8) < ((double)(iVar15 + 1) - dVar4) / dVar3) {
              lVar13 = lVar13 + 8 + uVar6 * 8;
              uVar6 = ~uVar6 + uVar14;
            }
            uVar14 = uVar6;
          } while (0 < (long)uVar6);
        }
        uVar14 = (ulong)(lVar13 - values) >> 3;
      }
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar4;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar3;
      if ((int)uVar14 < (int)num_keys) {
        piVar7 = (int *)(values + (long)(int)uVar14 * 8);
        do {
          auVar18._0_8_ = (double)*piVar7;
          auVar18._8_8_ = in_XMM4_Qb;
          auVar18 = vfmadd213sd_fma(auVar18,auVar19,auVar20);
          if (iVar15 < (int)auVar18._0_8_) goto LAB_0012c949;
          uVar10 = (int)uVar14 + 1;
          uVar14 = (ulong)uVar10;
          piVar7 = piVar7 + 2;
        } while (num_keys != uVar10);
        uVar14 = (ulong)num_keys;
      }
LAB_0012c949:
      iVar11 = (int)uVar14;
      iVar9 = (int)uVar12;
      num_keys_00 = iVar11 - iVar9;
      if (num_keys_00 == 0) {
        local_d8.cost = 0.0;
        local_d8.expected_avg_search_iterations = 0.0;
        local_d8.expected_avg_shifts = 0.0;
        local_d8.a = 0.0;
        local_d8.b = 0.0;
        local_d8.num_keys = 0;
        local_d8.node_id = iVar15;
        local_d8.level = level;
        local_d8.right_boundary = iVar11;
        local_d8.left_boundary = iVar9;
        local_d8._24_8_ = 0;
        iVar2._M_current =
             (used_fanout_tree_nodes->
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (used_fanout_tree_nodes->
            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
          _M_realloc_insert<alex::fanout_tree::FTNode>(used_fanout_tree_nodes,iVar2,&local_d8);
        }
        else {
          *(ulong *)&(iVar2._M_current)->num_keys = (ulong)(uint)local_d8._68_4_ << 0x20;
          (iVar2._M_current)->level = level;
          (iVar2._M_current)->node_id = iVar15;
          (iVar2._M_current)->cost = 0.0;
          (iVar2._M_current)->left_boundary = iVar9;
          (iVar2._M_current)->right_boundary = iVar11;
          *(undefined8 *)&(iVar2._M_current)->use = 0;
          (iVar2._M_current)->expected_avg_search_iterations = 0.0;
          (iVar2._M_current)->expected_avg_shifts = 0.0;
          (iVar2._M_current)->a = 0.0;
          (iVar2._M_current)->b = 0.0;
          ppFVar1 = &(used_fanout_tree_nodes->
                     super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppFVar1 = *ppFVar1 + 1;
        }
      }
      else {
        local_78.a_ = 0.0;
        local_78.b_ = 0.0;
        values_00 = (V *)(values + (long)iVar9 * 8);
        local_88 = (double)CONCAT44(local_88._4_4_,iVar9);
        AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
        build_model(values_00,num_keys_00,&local_78,approximate_model_computation);
        used_fanout_tree_nodes = local_58;
        local_48.num_search_iterations = 0.0;
        local_48.num_shifts = 0.0;
        dVar17 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                 ::compute_expected_cost
                           (values_00,num_keys_00,0.7,local_50,&local_78,
                            approximate_cost_computation,&local_48);
        local_d8.cost =
             (double)((ulong)(max_data_node_keys < num_keys_00) * (long)(dVar17 + 20.0) +
                     (ulong)(num_keys_00 <= max_data_node_keys) * (long)dVar17);
        local_d8.node_id = iVar15;
        local_d8.level = level;
        local_d8.right_boundary = iVar11;
        local_d8.left_boundary = SUB84(local_88,0);
        local_d8._24_8_ = local_d8._24_8_ & 0xffffffffffffff00;
        local_d8.a = local_78.a_;
        local_d8.b = local_78.b_;
        local_d8.expected_avg_search_iterations = local_48.num_search_iterations;
        local_d8.expected_avg_shifts = local_48.num_shifts;
        iVar2._M_current =
             (used_fanout_tree_nodes->
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        local_d8.num_keys = num_keys_00;
        if (iVar2._M_current ==
            (used_fanout_tree_nodes->
            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_88 = local_d8.cost;
          std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
          _M_realloc_insert<alex::fanout_tree::FTNode>(used_fanout_tree_nodes,iVar2,&local_d8);
          dVar17 = local_88;
        }
        else {
          *(ulong *)&(iVar2._M_current)->num_keys = CONCAT44(local_d8._68_4_,num_keys_00);
          (iVar2._M_current)->level = level;
          (iVar2._M_current)->node_id = iVar15;
          (iVar2._M_current)->cost = local_d8.cost;
          (iVar2._M_current)->left_boundary = SUB84(local_88,0);
          (iVar2._M_current)->right_boundary = iVar11;
          (iVar2._M_current)->use = local_d8.use;
          *(undefined7 *)&(iVar2._M_current)->field_0x19 = local_d8._25_7_;
          (iVar2._M_current)->expected_avg_search_iterations = local_48.num_search_iterations;
          (iVar2._M_current)->expected_avg_shifts = local_48.num_shifts;
          (iVar2._M_current)->a = local_78.a_;
          (iVar2._M_current)->b = local_78.b_;
          ppFVar1 = &(used_fanout_tree_nodes->
                     super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppFVar1 = *ppFVar1 + 1;
          dVar17 = local_d8.cost;
        }
        local_110 = local_110 + (dVar17 * (double)num_keys_00) / local_60;
      }
      iVar15 = iVar15 + 1;
      uVar12 = uVar14;
    } while (iVar15 != iVar8);
  }
  return (dVar16 * 5e-07 * 208.0 * (double)total_keys) / (double)(int)num_keys + 20.0 + local_110;
}

Assistant:

double compute_level(const std::pair<T, P> values[], int num_keys,
                     const AlexNode<T, P>* node, int total_keys,
                     std::vector<FTNode>& used_fanout_tree_nodes, int level,
                     int max_data_node_keys, double expected_insert_frac = 0,
                     bool approximate_model_computation = true,
                     bool approximate_cost_computation = false,
                     Compare key_less = Compare()) {
  int fanout = 1 << level;
  double cost = 0.0;
  double a = node->model_.a_ * fanout;
  double b = node->model_.b_ * fanout;
  int left_boundary = 0;
  int right_boundary = 0;
  for (int i = 0; i < fanout; i++) {
    left_boundary = right_boundary;
    right_boundary =
        i == fanout - 1
            ? num_keys
            : static_cast<int>(
                  std::lower_bound(values, values + num_keys, ((i + 1) - b) / a,
                                   [key_less](auto const& a, auto const& b) {
                                     return key_less(a.first, b);
                                   }) -
                  values);
    // Account for off-by-one errors due to floating-point precision issues.
    while (right_boundary < num_keys &&
           static_cast<int>(a * values[right_boundary].first + b) <= i) {
      right_boundary++;
    }
    if (left_boundary == right_boundary) {
      used_fanout_tree_nodes.push_back(
          {level, i, 0, left_boundary, right_boundary, false, 0, 0, 0, 0, 0});
      continue;
    }
    LinearModel<T> model;
    AlexDataNode<T, P>::build_model(values + left_boundary,
                                    right_boundary - left_boundary, &model,
                                    approximate_model_computation);

    DataNodeStats stats;
    double node_cost = AlexDataNode<T, P>::compute_expected_cost(
        values + left_boundary, right_boundary - left_boundary,
        AlexDataNode<T, P>::kInitDensity_, expected_insert_frac, &model,
        approximate_cost_computation, &stats);
    // If the node is too big to be a data node, proactively incorporate an
    // extra tree traversal level into the cost.
    if (right_boundary - left_boundary > max_data_node_keys) {
      node_cost += kNodeLookupsWeight;
    }

    cost += node_cost * (right_boundary - left_boundary) / num_keys;

    used_fanout_tree_nodes.push_back(
        {level, i, node_cost, left_boundary, right_boundary, false,
         stats.num_search_iterations, stats.num_shifts, model.a_, model.b_,
         right_boundary - left_boundary});
  }
  double traversal_cost =
      kNodeLookupsWeight +
      (kModelSizeWeight * fanout *
       (sizeof(AlexDataNode<T, P>) + sizeof(void*)) * total_keys / num_keys);
  cost += traversal_cost;
  return cost;
}